

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_dispatch.c
# Opt level: O2

void blake3_compress_in_place
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags)

{
  cpu_feature cVar1;
  
  cVar1 = get_cpu_features();
  if ((cVar1 & SSE41) != 0) {
    blake3_compress_in_place_sse41(cv,block,block_len,counter,flags);
    return;
  }
  if ((cVar1 & SSE2) == 0) {
    blake3_compress_in_place_portable(cv,block,block_len,counter,flags);
    return;
  }
  blake3_compress_in_place_sse2(cv,block,block_len,counter,flags);
  return;
}

Assistant:

void blake3_compress_in_place(uint32_t cv[8],
                              const uint8_t block[BLAKE3_BLOCK_LEN],
                              uint8_t block_len, uint64_t counter,
                              uint8_t flags) {
#if defined(IS_X86)
  const enum cpu_feature features = get_cpu_features();
#if !defined(BLAKE3_NO_AVX512)
  if (features & AVX512VL) {
    blake3_compress_in_place_avx512(cv, block, block_len, counter, flags);
    return;
  }
#endif
#if !defined(BLAKE3_NO_SSE41)
  if (features & SSE41) {
    blake3_compress_in_place_sse41(cv, block, block_len, counter, flags);
    return;
  }
#endif
#if !defined(BLAKE3_NO_SSE2)
  if (features & SSE2) {
    blake3_compress_in_place_sse2(cv, block, block_len, counter, flags);
    return;
  }
#endif
#endif
  blake3_compress_in_place_portable(cv, block, block_len, counter, flags);
}